

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

bool cmSystemTools::SetRPath(string *file,string *newRPath,string *emsg,bool *changed)

{
  bool bVar1;
  bool *pbVar2;
  ulong uVar3;
  _Optional_payload_base<bool> local_34;
  _Optional_payload_base<bool> local_32;
  optional<bool> result_1;
  bool *pbStack_30;
  optional<bool> result;
  bool *changed_local;
  string *emsg_local;
  string *newRPath_local;
  string *file_local;
  
  pbStack_30 = changed;
  local_32 = (_Optional_payload_base<bool>)SetRPathELF(file,newRPath,emsg,changed);
  bVar1 = std::optional::operator_cast_to_bool((optional *)&local_32);
  if (bVar1) {
    pbVar2 = std::optional<bool>::value((optional<bool> *)&local_32);
    file_local._7_1_ = (bool)(*pbVar2 & 1);
  }
  else {
    local_34 = (_Optional_payload_base<bool>)SetRPathXCOFF(file,newRPath,emsg,pbStack_30);
    bVar1 = std::optional::operator_cast_to_bool((optional *)&local_34);
    if (bVar1) {
      pbVar2 = std::optional<bool>::value((optional<bool> *)&local_34);
      file_local._7_1_ = (bool)(*pbVar2 & 1);
    }
    else {
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        if (emsg != (string *)0x0) {
          std::__cxx11::string::operator=((string *)emsg,"The file format is not recognized.");
        }
        file_local._7_1_ = false;
      }
      else {
        file_local._7_1_ = true;
      }
    }
  }
  return file_local._7_1_;
}

Assistant:

bool cmSystemTools::SetRPath(std::string const& file,
                             std::string const& newRPath, std::string* emsg,
                             bool* changed)
{
  if (cm::optional<bool> result = SetRPathELF(file, newRPath, emsg, changed)) {
    return result.value();
  }
  if (cm::optional<bool> result =
        SetRPathXCOFF(file, newRPath, emsg, changed)) {
    return result.value();
  }
  // The file format is not recognized.  Assume it has no RPATH.
  if (newRPath.empty()) {
    // The caller wanted no RPATH anyway.
    return true;
  }
  if (emsg) {
    *emsg = "The file format is not recognized.";
  }
  return false;
}